

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRecursiveUsersWithConcreteType
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *access_chain,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *final_users)

{
  Instruction *def;
  IRContext *this_00;
  DefUseManager *this_01;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  work_list;
  Instruction *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b0 = access_chain;
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_initialize_map(&local_88,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
    _M_push_back_aux<spvtools::opt::Instruction*const&>
              ((deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
               &local_88,&local_b0);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_b0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      def = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      this_00 = (this->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      this_01 = (this_00->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
      local_98 = (code *)0x0;
      pcStack_90 = (code *)0x0;
      local_a8._M_unused._M_object = (void *)0x0;
      local_a8._8_8_ = 0;
      local_a8._M_unused._M_object = operator_new(0x18);
      *(ReplaceDescArrayAccessUsingVarIndex **)local_a8._M_unused._0_8_ = this;
      *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
       ((long)local_a8._M_unused._0_8_ + 8) = final_users;
      *(_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
       ((long)local_a8._M_unused._0_8_ + 0x10) = &local_88;
      pcStack_90 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:111:30)>
                   ::_M_invoke;
      local_98 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:111:30)>
                 ::_M_manager;
      analysis::DefUseManager::ForEachUser
                (this_01,def,(function<void_(spvtools::opt::Instruction_*)> *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Deque_base(&local_88);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::CollectRecursiveUsersWithConcreteType(
    Instruction* access_chain, std::vector<Instruction*>* final_users) const {
  std::queue<Instruction*> work_list;
  work_list.push(access_chain);
  while (!work_list.empty()) {
    auto* inst_from_work_list = work_list.front();
    work_list.pop();
    get_def_use_mgr()->ForEachUser(
        inst_from_work_list, [this, final_users, &work_list](Instruction* use) {
          // TODO: Support Boolean type as well.
          if (!use->HasResultId() || IsConcreteType(use->type_id())) {
            final_users->push_back(use);
          } else {
            work_list.push(use);
          }
        });
  }
}